

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point-to-point.hpp
# Opt level: O2

request diy::mpi::detail::isend<std::vector<char,std::allocator<char>>>
                  (DIY_MPI_Comm comm,int dest,int tag,vector<char,_std::allocator<char>_> *x)

{
  pointer data;
  pointer pcVar1;
  request rVar2;
  int count;
  datatype local_8;
  
  data = (x->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
         _M_start;
  pcVar1 = (x->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  count = 0;
  if (data != pcVar1) {
    count = (int)pcVar1 - (int)data;
  }
  local_8.handle.data = (DIY_MPI_Datatype)&ompi_mpi_byte;
  rVar2 = isend(comm,dest,tag,data,count,&local_8);
  return (request)rVar2.handle.data;
}

Assistant:

request isend(DIY_MPI_Comm comm, int dest, int tag, const T& x)
  {
    static_assert(std::is_same<typename is_mpi_datatype<T>::type, true_type>::value, "is_mpi_datatype<T>::type must be true_type");
    return isend(comm, dest, tag, address(x), count(x), datatype_of(x));
  }